

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameclient.cpp
# Opt level: O2

void __thiscall
CGameClient::CClientData::Reset(CClientData *this,CGameClient *pGameClient,int ClientID)

{
  char *pcVar1;
  undefined8 *puVar2;
  CSkinPart *pCVar3;
  int Part;
  long lVar4;
  
  Part = 0;
  this->m_aName[0] = '\0';
  this->m_aClan[0] = '\0';
  this->m_Country = -1;
  this->m_Team = 0;
  this->m_Angle = 0.0;
  this->m_Emoticon = 0;
  this->m_EmoticonStart = -1;
  this->m_Active = false;
  this->m_ChatIgnore = false;
  this->m_Friend = false;
  (this->m_Evolved).super_CNetObj_CharacterCore.m_Tick = -1;
  for (lVar4 = 0x2f0; lVar4 != 0x308; lVar4 = lVar4 + 4) {
    pcVar1 = this->m_aName + lVar4;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pCVar3 = CSkins::GetSkinPart(pGameClient->m_pSkins,Part,0);
    *(int *)(this->m_aaSkinPartNames[1] + lVar4 + 0x4f) = (pCVar3->m_ColorTexture).m_Id;
    puVar2 = (undefined8 *)((long)this + lVar4 * 4 + -0x774);
    *puVar2 = 0x3f8000003f800000;
    puVar2[1] = 0x3f8000003f800000;
    Part = Part + 1;
  }
  UpdateRenderInfo(this,pGameClient,ClientID,false);
  return;
}

Assistant:

void CGameClient::CClientData::Reset(CGameClient *pGameClient, int ClientID)
{
	m_aName[0] = 0;
	m_aClan[0] = 0;
	m_Country = -1;
	m_Team = 0;
	m_Angle = 0;
	m_Emoticon = 0;
	m_EmoticonStart = -1;
	m_Active = false;
	m_ChatIgnore = false;
	m_Friend = false;
	m_Evolved.m_Tick = -1;
	for(int p = 0; p < NUM_SKINPARTS; p++)
	{
		m_SkinPartIDs[p] = 0;
		m_SkinInfo.m_aTextures[p] = pGameClient->m_pSkins->GetSkinPart(p, 0)->m_ColorTexture;
		m_SkinInfo.m_aColors[p] = vec4(1.0f, 1.0f, 1.0f , 1.0f);
	}
	UpdateRenderInfo(pGameClient, ClientID, false);
}